

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::PrintXmlUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  int iVar1;
  ostream *poVar2;
  TestCase *pTVar3;
  TimeInMillis ms;
  TimeInMillis ms_00;
  TestResult *extraout_RDX;
  TestResult *extraout_RDX_00;
  TestResult *result;
  int i;
  int i_00;
  string kTestsuites;
  allocator<char> local_7d;
  int local_7c;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"testsuites",(allocator<char> *)&local_78);
  std::operator<<(stream,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar2 = std::operator<<(stream,"<");
  std::operator<<(poVar2,(string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"tests",&local_7d);
  local_7c = UnitTest::reportable_test_count(unit_test);
  StreamableToString<int>(&local_58,&local_7c);
  OutputXmlAttribute(stream,&local_38,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"failures",&local_7d);
  local_7c = UnitTest::failed_test_count(unit_test);
  StreamableToString<int>(&local_58,&local_7c);
  OutputXmlAttribute(stream,&local_38,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"disabled",&local_7d);
  local_7c = UnitTest::reportable_disabled_test_count(unit_test);
  StreamableToString<int>(&local_58,&local_7c);
  OutputXmlAttribute(stream,&local_38,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"errors",(allocator<char> *)&local_7c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"0",&local_7d);
  OutputXmlAttribute(stream,&local_38,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"timestamp",(allocator<char> *)&local_7c);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_
            (&local_58,(internal *)unit_test->impl_->start_timestamp_,ms);
  OutputXmlAttribute(stream,&local_38,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"time",(allocator<char> *)&local_7c);
  FormatTimeInMillisAsSeconds_abi_cxx11_
            (&local_58,(internal *)unit_test->impl_->elapsed_time_,ms_00);
  OutputXmlAttribute(stream,&local_38,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  result = extraout_RDX;
  if (FLAGS_gtest_shuffle == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"random_seed",&local_7d);
    local_7c = unit_test->impl_->random_seed_;
    StreamableToString<int>(&local_58,&local_7c);
    OutputXmlAttribute(stream,&local_38,&local_78,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    result = extraout_RDX_00;
  }
  TestPropertiesAsXmlAttributes_abi_cxx11_
            (&local_78,(XmlUnitTestResultPrinter *)&unit_test->impl_->ad_hoc_test_result_,result);
  std::operator<<(stream,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"name",(allocator<char> *)&local_7c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"AllTests",&local_7d);
  OutputXmlAttribute(stream,&local_38,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::operator<<(stream,">\n");
  for (i_00 = 0;
      i_00 < (int)((ulong)((long)(unit_test->impl_->test_cases_).
                                 super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(unit_test->impl_->test_cases_).
                                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3); i_00 = i_00 + 1) {
    pTVar3 = UnitTest::GetTestCase(unit_test,i_00);
    iVar1 = TestCase::reportable_test_count(pTVar3);
    if (0 < iVar1) {
      pTVar3 = UnitTest::GetTestCase(unit_test,i_00);
      PrintXmlTestCase(stream,pTVar3);
    }
  }
  poVar2 = std::operator<<(stream,"</");
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  std::operator<<(poVar2,">\n");
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlUnitTest(std::ostream* stream,
                                                const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(unit_test.reportable_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "failures",
                     StreamableToString(unit_test.failed_test_count()));
  OutputXmlAttribute(
      stream, kTestsuites, "disabled",
      StreamableToString(unit_test.reportable_disabled_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "errors", "0");
  OutputXmlAttribute(
      stream, kTestsuites, "timestamp",
      FormatEpochTimeInMillisAsIso8601(unit_test.start_timestamp()));
  OutputXmlAttribute(stream, kTestsuites, "time",
                     FormatTimeInMillisAsSeconds(unit_test.elapsed_time()));

  if (GTEST_FLAG(shuffle)) {
    OutputXmlAttribute(stream, kTestsuites, "random_seed",
                       StreamableToString(unit_test.random_seed()));
  }

  *stream << TestPropertiesAsXmlAttributes(unit_test.ad_hoc_test_result());

  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0)
      PrintXmlTestCase(stream, *unit_test.GetTestCase(i));
  }
  *stream << "</" << kTestsuites << ">\n";
}